

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_function_generator.cc
# Opt level: O2

vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
* google::protobuf::compiler::cpp::ParseFunctionGenerator::BuildFieldOptions
            (vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
             *__return_storage_ptr__,Descriptor *descriptor,
            Span<const_google::protobuf::FieldDescriptor_*const> ordered_fields,Options *options,
            MessageSCCAnalyzer *scc_analyzer,Span<const_int> has_bit_indices,
            Span<const_int> inlined_string_indices)

{
  FieldDescriptor *this;
  int iVar1;
  int iVar2;
  reference ppFVar3;
  char *pcVar4;
  Nullable<const_char_*> failure_msg;
  reference piVar5;
  optional<float> oVar6;
  int __c;
  int __c_00;
  char *i;
  char *__s;
  ulong i_00;
  FieldOptions local_60;
  Span<const_google::protobuf::FieldDescriptor_*const> ordered_fields_local;
  
  pcVar4 = (char *)ordered_fields.len_;
  ordered_fields_local.ptr_ = ordered_fields.ptr_;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ordered_fields_local.len_ = (size_type)pcVar4;
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  ::reserve(__return_storage_ptr__,(size_type)pcVar4);
  i = (char *)0x0;
  while( true ) {
    if (pcVar4 <= i) {
      return __return_storage_ptr__;
    }
    pcVar4 = i;
    ppFVar3 = absl::lts_20250127::Span<const_google::protobuf::FieldDescriptor_*const>::operator[]
                        (&ordered_fields_local,(size_type)i);
    this = *ppFVar3;
    pcVar4 = FieldDescriptor::index(this,pcVar4,__c);
    __s = (char *)0x0;
    failure_msg = absl::lts_20250127::log_internal::Check_GEImpl
                            ((int)pcVar4,0,"field->index() >= 0");
    if (failure_msg != (Nullable<const_char_*>)0x0) break;
    pcVar4 = FieldDescriptor::index(this,__s,__c_00);
    i_00 = (ulong)(int)pcVar4;
    iVar1 = -1;
    iVar2 = iVar1;
    local_60.field = this;
    if (i_00 < has_bit_indices.len_) {
      piVar5 = absl::lts_20250127::Span<const_int>::operator[](&has_bit_indices,i_00);
      iVar2 = *piVar5;
    }
    local_60.has_bit_index = iVar2;
    oVar6 = GetPresenceProbability(this,options);
    local_60.presence_probability = 0.5;
    if (((ulong)oVar6.super__Optional_base<float,_true,_true>._M_payload.
                super__Optional_payload_base<float> >> 0x20 & 1) != 0) {
      local_60.presence_probability =
           oVar6.super__Optional_base<float,_true,_true>._M_payload.
           super__Optional_payload_base<float>._M_payload;
    }
    local_60.lazy_opt = GetLazyStyle(this,options,scc_analyzer);
    local_60.is_string_inlined = IsStringInlined(this,options);
    local_60.is_implicitly_weak = IsImplicitWeakField(this,options,scc_analyzer);
    local_60.use_direct_tcparser_table = true;
    local_60.should_split = ShouldSplit(this,options);
    if (i_00 < inlined_string_indices.len_) {
      piVar5 = absl::lts_20250127::Span<const_int>::operator[](&inlined_string_indices,i_00);
      iVar1 = *piVar5;
    }
    local_60.inlined_string_index = iVar1;
    local_60.use_micro_string = IsMicroString(this,options);
    std::
    vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
    ::emplace_back<google::protobuf::internal::TailCallTableInfo::FieldOptions>
              (__return_storage_ptr__,&local_60);
    i = i + 1;
    pcVar4 = (char *)ordered_fields_local.len_;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/parse_function_generator.cc"
             ,0x59,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_60);
}

Assistant:

std::vector<internal::TailCallTableInfo::FieldOptions>
ParseFunctionGenerator::BuildFieldOptions(
    const Descriptor* descriptor,
    absl::Span<const FieldDescriptor* const> ordered_fields,
    const Options& options, MessageSCCAnalyzer* scc_analyzer,
    absl::Span<const int> has_bit_indices,
    absl::Span<const int> inlined_string_indices) {
  std::vector<TailCallTableInfo::FieldOptions> fields;
  fields.reserve(ordered_fields.size());
  for (size_t i = 0; i < ordered_fields.size(); ++i) {
    auto* field = ordered_fields[i];
    ABSL_CHECK_GE(field->index(), 0);
    size_t index = static_cast<size_t>(field->index());
    fields.push_back({
        field,
        index < has_bit_indices.size() ? has_bit_indices[index] : -1,
        GetPresenceProbability(field, options)
            .value_or(kUnknownPresenceProbability),
        GetLazyStyle(field, options, scc_analyzer),
        IsStringInlined(field, options),
        IsImplicitWeakField(field, options, scc_analyzer),
        /* use_direct_tcparser_table */ true,
        ShouldSplit(field, options),
        index < inlined_string_indices.size() ? inlined_string_indices[index]
                                              : -1,
        IsMicroString(field, options),
    });
  }
  return fields;
}